

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

int Abc_NtkCheckRecursive(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  void *pvVar1;
  void *pvVar2;
  int i;
  int i_00;
  int iVar3;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieCec.c"
                  ,0x279,"int Abc_NtkCheckRecursive(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("!Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieCec.c"
                  ,0x27a,"int Abc_NtkCheckRecursive(Abc_Ntk_t *)");
  }
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    iVar3 = 0;
  }
  else {
    p = pNtk->pDesign->vModules;
    iVar3 = 0;
    for (i = 0; i < p->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(p,i);
      for (i_00 = 0; i_00 < (*(Vec_Ptr_t **)((long)pvVar1 + 0x20))->nSize; i_00 = i_00 + 1) {
        pvVar2 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar1 + 0x20),i_00);
        if (pvVar2 != (void *)0x0) {
          if (((*(uint *)((long)pvVar2 + 0x14) & 0xe) == 8 ||
               (*(uint *)((long)pvVar2 + 0x14) & 0xf) == 10) &&
             (*(void **)((long)pvVar2 + 0x38) == pvVar1)) {
            printf("WARNING: Model \"%s\" contains a recursive definition.\n",
                   *(undefined8 *)((long)pvVar1 + 8));
            iVar3 = 1;
            break;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int Abc_NtkCheckRecursive( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pObj;
    int i, k, RetValue = 0;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );

    if ( pNtk->pDesign == NULL )
        return RetValue;

    vMods = pNtk->pDesign->vModules;
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
    {
        Abc_NtkForEachObj( pModel, pObj, k )
            if ( Abc_ObjIsBox(pObj) && pObj->pData == (void *)pModel )
            {
                printf( "WARNING: Model \"%s\" contains a recursive definition.\n", Abc_NtkName(pModel) );
                RetValue = 1;
                break;
            }
    }
    return RetValue;
}